

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O3

int BN_sub_word(BIGNUM *a,ulong w)

{
  int iVar1;
  int iVar2;
  ulong *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar2 = 1;
  if (w != 0) {
    iVar1 = BN_is_zero((BIGNUM *)a);
    if (iVar1 == 0) {
      if (a->neg == 0) {
        iVar1 = a->top;
        puVar3 = a->d;
        uVar5 = *puVar3;
        if (uVar5 < w && iVar1 == 1) {
          *puVar3 = w - uVar5;
          a->neg = 1;
        }
        else {
          iVar4 = 0;
          uVar6 = uVar5 - w;
          if (uVar5 < w) {
            do {
              *puVar3 = uVar6;
              uVar5 = puVar3[1];
              puVar3 = puVar3 + 1;
              iVar4 = iVar4 + 1;
              uVar6 = 0xffffffffffffffff;
            } while (uVar5 == 0);
            w = 1;
          }
          *puVar3 = uVar5 - w;
          if (uVar5 - w == 0 && iVar4 == iVar1 + -1) {
            a->top = iVar4;
          }
        }
      }
      else {
        a->neg = 0;
        iVar2 = BN_add_word(a,w);
        a->neg = 1;
      }
    }
    else {
      iVar2 = BN_set_word(a,w);
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        BN_set_negative(a,1);
      }
    }
  }
  return iVar2;
}

Assistant:

int BN_sub_word(BIGNUM *a, BN_ULONG w)
{
    int i;

    bn_check_top(a);
    w &= BN_MASK2;

    /* degenerate case: w is zero */
    if (!w)
        return 1;
    /* degenerate case: a is zero */
    if (BN_is_zero(a)) {
        i = BN_set_word(a, w);
        if (i != 0)
            BN_set_negative(a, 1);
        return i;
    }
    /* handle 'a' when negative */
    if (a->neg) {
        a->neg = 0;
        i = BN_add_word(a, w);
        a->neg = 1;
        return (i);
    }

    if ((a->top == 1) && (a->d[0] < w)) {
        a->d[0] = w - a->d[0];
        a->neg = 1;
        return (1);
    }
    i = 0;
    for (;;) {
        if (a->d[i] >= w) {
            a->d[i] -= w;
            break;
        } else {
            a->d[i] = (a->d[i] - w) & BN_MASK2;
            i++;
            w = 1;
        }
    }
    if ((a->d[i] == 0) && (i == (a->top - 1)))
        a->top--;
    bn_check_top(a);
    return (1);
}